

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O0

void __thiscall de::anon_unknown_0::TestExitThread::run(TestExitThread *this)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  int iVar4;
  int local_2c;
  int iterNdx;
  int invExitProb;
  Random rnd;
  int numIters;
  TestExitThread *this_local;
  
  rnd.m_rnd.z = 10000;
  unique0x100000f1 = this;
  dVar1 = deInt32Hash(this->m_numThreads);
  dVar2 = deInt32Hash(this->m_threadNdx);
  dVar3 = deInt32Hash(this->m_waitMode);
  Random::Random((Random *)&iterNdx,dVar1 ^ dVar2 ^ dVar3);
  local_2c = 0;
  do {
    if (9999 < local_2c) {
LAB_012ea4d8:
      Random::~Random((Random *)&iterNdx);
      return;
    }
    iVar4 = Random::getInt((Random *)&iterNdx,0,1000);
    if (iVar4 == 0) {
      SpinBarrier::removeThread(this->m_barrier,this->m_waitMode);
      goto LAB_012ea4d8;
    }
    SpinBarrier::sync(this->m_barrier);
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void run (void)
	{
		const int	numIters	= 10000;
		de::Random	rnd			(deInt32Hash(m_numThreads) ^ deInt32Hash(m_threadNdx) ^ deInt32Hash((deInt32)m_waitMode));
		const int	invExitProb	= 1000;

		for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
		{
			if (rnd.getInt(0, invExitProb) == 0)
			{
				m_barrier.removeThread(m_waitMode);
				break;
			}
			else
				m_barrier.sync(m_waitMode);
		}
	}